

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontTrueType.cpp
# Opt level: O1

bool __thiscall
WrittenFontTrueType::AddANSICandidates
          (WrittenFontTrueType *this,GlyphUnicodeMappingList *inGlyphsList,UShortList *ioCandidates)

{
  size_t *psVar1;
  unsigned_long inUnicodeCharacter;
  BoolAndByte BVar2;
  _List_node_base *p_Var3;
  byte bVar4;
  _List_node_base *p_Var5;
  WinAnsiEncoding winAnsiEncoding;
  WinAnsiEncoding local_29;
  
  if (this->fontSupportsWinAnsiEncoding == true) {
    WinAnsiEncoding::WinAnsiEncoding(&local_29);
    p_Var5 = (inGlyphsList->
             super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>)._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)inGlyphsList) {
      bVar4 = 1;
    }
    else {
      do {
        if (((long)p_Var5[1]._M_prev - (long)p_Var5[1]._M_next == 8) &&
           (inUnicodeCharacter = (unsigned_long)(p_Var5[1]._M_next)->_M_next,
           inUnicodeCharacter != 0x2022)) {
          BVar2 = WinAnsiEncoding::Encode(&local_29,inUnicodeCharacter);
          if (((ushort)BVar2 & 1) != 0) {
            p_Var3 = (_List_node_base *)operator_new(0x18);
            *(ushort *)&p_Var3[1]._M_next = (ushort)BVar2 >> 8;
            std::__detail::_List_node_base::_M_hook(p_Var3);
            psVar1 = &(ioCandidates->
                      super__List_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                      _M_node._M_size;
            *psVar1 = *psVar1 + 1;
          }
        }
        else {
          BVar2.first = false;
          BVar2.second = '\0';
        }
        bVar4 = BVar2.first;
        p_Var5 = (((_List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_> *)
                  &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while ((p_Var5 != (_List_node_base *)inGlyphsList) && (((ushort)BVar2 & 1) != 0));
    }
    WinAnsiEncoding::~WinAnsiEncoding(&local_29);
  }
  else {
    bVar4 = 0;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool WrittenFontTrueType::AddANSICandidates(const GlyphUnicodeMappingList& inGlyphsList, UShortList& ioCandidates) {
	if(!fontSupportsWinAnsiEncoding) {
		return false;
	}

	// i'm totally relying on the text here, which is fine till i'll do ligatures, in which case
	// i'll need to make something different out of the text.
	// as you can see this has little to do with glyphs (mainly cause i can't use FreeType to map the glyphs
	// back to the rleevant unicode values...but no need anyways...that's why i carry the text).
	BoolAndByte encodingResult(true,0);
	WinAnsiEncoding winAnsiEncoding;
	GlyphUnicodeMappingList::const_iterator it = inGlyphsList.begin(); 

	for(; it != inGlyphsList.end() && encodingResult.first; ++it)
	{
		// don't bother with characters of more (or less) than one unicode
		if(it->mUnicodeValues.size() != 1)
		{
			encodingResult.first = false;
		}
		else if(0x2022 == it->mUnicodeValues.front())
		{
			// From the reference:
			// In WinAnsiEncoding, all unused codes greater than 40 map to the bullet character. 
			// However, only code 225 is specifically assigned to the bullet character; other codes are subject to future reassignment.

			// now i don't know if it's related or not...but acrobat isn't happy when i'm using winansi with bullet. and text coming after that bullet may be
			// corrupted.
			// so i'm forcing CID if i hit bullet till i know better.
			encodingResult.first = false;
		}
		else
		{
			encodingResult = winAnsiEncoding.Encode(it->mUnicodeValues.front());
			if(encodingResult.first)
				ioCandidates.push_back(encodingResult.second);
		}
	}

	return encodingResult.first;
}